

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AddWeak
          (RepeatedPtrFieldBase *this,MessageLite *prototype)

{
  int iVar1;
  int iVar2;
  Rep *pRVar3;
  undefined4 extraout_var;
  ImplicitWeakMessage *pIVar4;
  
  pRVar3 = this->rep_;
  if (pRVar3 == (Rep *)0x0) {
    iVar2 = this->total_size_;
  }
  else {
    iVar1 = this->current_size_;
    iVar2 = pRVar3->allocated_size;
    if (iVar1 < iVar2) {
      this->current_size_ = iVar1 + 1;
      return (MessageLite *)pRVar3->elements[iVar1];
    }
    if (iVar2 != this->total_size_) goto LAB_002cb06c;
  }
  Reserve(this,iVar2 + 1);
  pRVar3 = this->rep_;
  iVar2 = pRVar3->allocated_size;
LAB_002cb06c:
  pRVar3->allocated_size = iVar2 + 1;
  if (prototype == (MessageLite *)0x0) {
    pIVar4 = Arena::CreateMessageInternal<google::protobuf::internal::ImplicitWeakMessage>
                       (this->arena_);
  }
  else {
    iVar2 = (*prototype->_vptr_MessageLite[3])(prototype);
    pIVar4 = (ImplicitWeakMessage *)CONCAT44(extraout_var,iVar2);
  }
  iVar2 = this->current_size_;
  this->current_size_ = iVar2 + 1;
  this->rep_->elements[iVar2] = pIVar4;
  return &pIVar4->super_MessageLite;
}

Assistant:

MessageLite* RepeatedPtrFieldBase::AddWeak(const MessageLite* prototype) {
  if (rep_ != nullptr && current_size_ < rep_->allocated_size) {
    return reinterpret_cast<MessageLite*>(rep_->elements[current_size_++]);
  }
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  ++rep_->allocated_size;
  MessageLite* result = prototype
                            ? prototype->New(arena_)
                            : Arena::CreateMessage<ImplicitWeakMessage>(arena_);
  rep_->elements[current_size_++] = result;
  return result;
}